

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigen_Colamd.h
# Opt level: O1

void Eigen::internal::init_scoring<int>
               (int n_row,int n_col,Colamd_Row<int> *Row,colamd_col<int> *Col,int *A,int *head,
               double *knobs,int *p_n_row2,int *p_n_col2,int *p_max_deg)

{
  int *piVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  colamd_col<int> *pcVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  anon_union_4_2_db423fdf_for_shared4 *paVar9;
  int iVar10;
  int *piVar11;
  ulong uVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  int local_34;
  
  dVar15 = (double)n_col;
  dVar14 = *knobs * dVar15;
  dVar17 = (double)n_row;
  dVar16 = knobs[1] * dVar17;
  uVar12 = (ulong)(n_col - 1);
  iVar13 = n_col;
  if (0 < n_col) {
    pcVar5 = Col + uVar12;
    lVar7 = uVar12 + 1;
    do {
      if (pcVar5->length == 0) {
        iVar13 = iVar13 + -1;
        (pcVar5->shared2).score = iVar13;
        pcVar5->start = -1;
      }
      pcVar5 = pcVar5 + -1;
      lVar3 = lVar7 + -1;
      bVar2 = 0 < lVar7;
      lVar7 = lVar3;
    } while (lVar3 != 0 && bVar2);
  }
  if (0 < n_col) {
    dVar18 = 0.0;
    if (0.0 <= dVar16) {
      dVar18 = dVar16;
    }
    uVar4 = uVar12;
    do {
      if (-1 < (long)Col[uVar4].start) {
        pcVar5 = Col + uVar4;
        iVar10 = pcVar5->length;
        if ((int)(double)(~-(ulong)(dVar16 < dVar17) & (ulong)dVar17 |
                         (ulong)dVar18 & -(ulong)(dVar16 < dVar17)) < iVar10) {
          iVar13 = iVar13 + -1;
          (pcVar5->shared2).score = iVar13;
          if (0 < iVar10) {
            piVar8 = A + Col[uVar4].start;
            piVar1 = piVar8 + iVar10;
            do {
              iVar10 = *piVar8;
              piVar8 = piVar8 + 1;
              Row[iVar10].shared1.degree = Row[iVar10].shared1.degree + -1;
            } while (piVar8 < piVar1);
          }
          pcVar5->start = -1;
        }
      }
      bVar2 = 0 < (long)uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar2);
  }
  if (n_row < 1) {
    local_34 = 0;
  }
  else {
    dVar16 = 0.0;
    if (0.0 <= dVar14) {
      dVar16 = dVar14;
    }
    uVar4 = (ulong)(uint)n_row;
    lVar7 = 0;
    local_34 = 0;
    do {
      iVar10 = *(int *)((long)&Row->shared1 + lVar7);
      if ((int)(double)(~-(ulong)(dVar14 < dVar15) & (ulong)dVar15 |
                       (ulong)dVar16 & -(ulong)(dVar14 < dVar15)) < iVar10 || iVar10 == 0) {
        *(undefined4 *)((long)&Row->shared2 + lVar7) = 0xffffffff;
        n_row = n_row + -1;
      }
      else if (local_34 <= iVar10) {
        local_34 = iVar10;
      }
      lVar7 = lVar7 + 0x10;
    } while (uVar4 << 4 != lVar7);
  }
  uVar4 = uVar12;
  if (0 < n_col) {
    do {
      if (-1 < (long)Col[uVar4].start) {
        pcVar5 = Col + uVar4;
        piVar8 = A + Col[uVar4].start;
        piVar1 = piVar8 + pcVar5->length;
        piVar11 = piVar8;
        iVar10 = 0;
        while (piVar11 < piVar1) {
          iVar6 = *piVar11;
          piVar11 = piVar11 + 1;
          if (-1 < Row[iVar6].shared2.mark) {
            *piVar8 = iVar6;
            piVar8 = piVar8 + 1;
            iVar10 = iVar10 + Row[iVar6].shared1.degree + -1;
            if (n_col <= iVar10) {
              iVar10 = n_col;
            }
          }
        }
        iVar6 = (int)((ulong)((long)piVar8 - (long)(A + (uint)pcVar5->start)) >> 2);
        if (iVar6 == 0) {
          iVar13 = iVar13 + -1;
          (pcVar5->shared2).score = iVar13;
          pcVar5->start = -1;
        }
        else {
          pcVar5->length = iVar6;
          (pcVar5->shared2).score = iVar10;
        }
      }
      bVar2 = 0 < (long)uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar2);
  }
  if (-1 < n_col) {
    memset(head,0xff,(ulong)(uint)n_col * 4 + 4);
  }
  if (0 < n_col) {
    paVar9 = &Col[uVar12].shared4;
    do {
      if (-1 < ((colamd_col<int> *)(paVar9 + -5))->start) {
        iVar10 = ((anon_union_4_2_0da084e5_for_shared2 *)(paVar9 + -2))->score;
        iVar6 = head[iVar10];
        ((anon_union_4_3_eabe2f71_for_shared3 *)(paVar9 + -1))->headhash = -1;
        paVar9->degree_next = iVar6;
        if ((long)iVar6 != -1) {
          Col[iVar6].shared3.headhash = (int)uVar12;
        }
        head[iVar10] = (int)uVar12;
      }
      paVar9 = paVar9 + -6;
      bVar2 = 0 < (long)uVar12;
      uVar12 = uVar12 - 1;
    } while (bVar2);
  }
  *p_n_col2 = iVar13;
  *p_n_row2 = n_row;
  *p_max_deg = local_34;
  return;
}

Assistant:

static void init_scoring
  (
    /* === Parameters ======================================================= */

    Index n_row,      /* number of rows of A */
    Index n_col,      /* number of columns of A */
    Colamd_Row<Index> Row [],    /* of size n_row+1 */
    colamd_col<Index> Col [],    /* of size n_col+1 */
    Index A [],     /* column form and row form of A */
    Index head [],    /* of size n_col+1 */
    double knobs [COLAMD_KNOBS],/* parameters */
    Index *p_n_row2,    /* number of non-dense, non-empty rows */
    Index *p_n_col2,    /* number of non-dense, non-empty columns */
    Index *p_max_deg    /* maximum row degree */
    )
{
  /* === Local variables ================================================== */

  Index c ;     /* a column index */
  Index r, row ;    /* a row index */
  Index *cp ;     /* a column pointer */
  Index deg ;     /* degree of a row or column */
  Index *cp_end ;   /* a pointer to the end of a column */
  Index *new_cp ;   /* new column pointer */
  Index col_length ;    /* length of pruned column */
  Index score ;     /* current column score */
  Index n_col2 ;    /* number of non-dense, non-empty columns */
  Index n_row2 ;    /* number of non-dense, non-empty rows */
  Index dense_row_count ; /* remove rows with more entries than this */
  Index dense_col_count ; /* remove cols with more entries than this */
  Index min_score ;   /* smallest column score */
  Index max_deg ;   /* maximum row degree */
  Index next_col ;    /* Used to add to degree list.*/


  /* === Extract knobs ==================================================== */

  dense_row_count = COLAMD_MAX (0, COLAMD_MIN (knobs [COLAMD_DENSE_ROW] * n_col, n_col)) ;
  dense_col_count = COLAMD_MAX (0, COLAMD_MIN (knobs [COLAMD_DENSE_COL] * n_row, n_row)) ;
  COLAMD_DEBUG1 (("colamd: densecount: %d %d\n", dense_row_count, dense_col_count)) ;
  max_deg = 0 ;
  n_col2 = n_col ;
  n_row2 = n_row ;

  /* === Kill empty columns =============================================== */

  /* Put the empty columns at the end in their natural order, so that LU */
  /* factorization can proceed as far as possible. */
  for (c = n_col-1 ; c >= 0 ; c--)
  {
    deg = Col [c].length ;
    if (deg == 0)
    {
      /* this is a empty column, kill and order it last */
      Col [c].shared2.order = --n_col2 ;
      KILL_PRINCIPAL_COL (c) ;
    }
  }
  COLAMD_DEBUG1 (("colamd: null columns killed: %d\n", n_col - n_col2)) ;

  /* === Kill dense columns =============================================== */

  /* Put the dense columns at the end, in their natural order */
  for (c = n_col-1 ; c >= 0 ; c--)
  {
    /* skip any dead columns */
    if (COL_IS_DEAD (c))
    {
      continue ;
    }
    deg = Col [c].length ;
    if (deg > dense_col_count)
    {
      /* this is a dense column, kill and order it last */
      Col [c].shared2.order = --n_col2 ;
      /* decrement the row degrees */
      cp = &A [Col [c].start] ;
      cp_end = cp + Col [c].length ;
      while (cp < cp_end)
      {
	Row [*cp++].shared1.degree-- ;
      }
      KILL_PRINCIPAL_COL (c) ;
    }
  }
  COLAMD_DEBUG1 (("colamd: Dense and null columns killed: %d\n", n_col - n_col2)) ;

  /* === Kill dense and empty rows ======================================== */

  for (r = 0 ; r < n_row ; r++)
  {
    deg = Row [r].shared1.degree ;
    COLAMD_ASSERT (deg >= 0 && deg <= n_col) ;
    if (deg > dense_row_count || deg == 0)
    {
      /* kill a dense or empty row */
      KILL_ROW (r) ;
      --n_row2 ;
    }
    else
    {
      /* keep track of max degree of remaining rows */
      max_deg = COLAMD_MAX (max_deg, deg) ;
    }
  }
  COLAMD_DEBUG1 (("colamd: Dense and null rows killed: %d\n", n_row - n_row2)) ;

  /* === Compute initial column scores ==================================== */

  /* At this point the row degrees are accurate.  They reflect the number */
  /* of "live" (non-dense) columns in each row.  No empty rows exist. */
  /* Some "live" columns may contain only dead rows, however.  These are */
  /* pruned in the code below. */

  /* now find the initial matlab score for each column */
  for (c = n_col-1 ; c >= 0 ; c--)
  {
    /* skip dead column */
    if (COL_IS_DEAD (c))
    {
      continue ;
    }
    score = 0 ;
    cp = &A [Col [c].start] ;
    new_cp = cp ;
    cp_end = cp + Col [c].length ;
    while (cp < cp_end)
    {
      /* get a row */
      row = *cp++ ;
      /* skip if dead */
      if (ROW_IS_DEAD (row))
      {
	continue ;
      }
      /* compact the column */
      *new_cp++ = row ;
      /* add row's external degree */
      score += Row [row].shared1.degree - 1 ;
      /* guard against integer overflow */
      score = COLAMD_MIN (score, n_col) ;
    }
    /* determine pruned column length */
    col_length = (Index) (new_cp - &A [Col [c].start]) ;
    if (col_length == 0)
    {
      /* a newly-made null column (all rows in this col are "dense" */
      /* and have already been killed) */
      COLAMD_DEBUG2 (("Newly null killed: %d\n", c)) ;
      Col [c].shared2.order = --n_col2 ;
      KILL_PRINCIPAL_COL (c) ;
    }
    else
    {
      /* set column length and set score */
      COLAMD_ASSERT (score >= 0) ;
      COLAMD_ASSERT (score <= n_col) ;
      Col [c].length = col_length ;
      Col [c].shared2.score = score ;
    }
  }
  COLAMD_DEBUG1 (("colamd: Dense, null, and newly-null columns killed: %d\n",
		  n_col-n_col2)) ;

  /* At this point, all empty rows and columns are dead.  All live columns */
  /* are "clean" (containing no dead rows) and simplicial (no supercolumns */
  /* yet).  Rows may contain dead columns, but all live rows contain at */
  /* least one live column. */

  /* === Initialize degree lists ========================================== */


  /* clear the hash buckets */
  for (c = 0 ; c <= n_col ; c++)
  {
    head [c] = COLAMD_EMPTY ;
  }
  min_score = n_col ;
  /* place in reverse order, so low column indices are at the front */
  /* of the lists.  This is to encourage natural tie-breaking */
  for (c = n_col-1 ; c >= 0 ; c--)
  {
    /* only add principal columns to degree lists */
    if (COL_IS_ALIVE (c))
    {
      COLAMD_DEBUG4 (("place %d score %d minscore %d ncol %d\n",
		      c, Col [c].shared2.score, min_score, n_col)) ;

      /* === Add columns score to DList =============================== */

      score = Col [c].shared2.score ;

      COLAMD_ASSERT (min_score >= 0) ;
      COLAMD_ASSERT (min_score <= n_col) ;
      COLAMD_ASSERT (score >= 0) ;
      COLAMD_ASSERT (score <= n_col) ;
      COLAMD_ASSERT (head [score] >= COLAMD_EMPTY) ;

      /* now add this column to dList at proper score location */
      next_col = head [score] ;
      Col [c].shared3.prev = COLAMD_EMPTY ;
      Col [c].shared4.degree_next = next_col ;

      /* if there already was a column with the same score, set its */
      /* previous pointer to this new column */
      if (next_col != COLAMD_EMPTY)
      {
	Col [next_col].shared3.prev = c ;
      }
      head [score] = c ;

      /* see if this score is less than current min */
      min_score = COLAMD_MIN (min_score, score) ;


    }
  }


  /* === Return number of remaining columns, and max row degree =========== */

  *p_n_col2 = n_col2 ;
  *p_n_row2 = n_row2 ;
  *p_max_deg = max_deg ;
}